

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

long __thiscall Am_Value::operator_cast_to_long(Am_Value *this)

{
  uint uVar1;
  double dVar2;
  Am_Value *this_local;
  
  uVar1 = (uint)this->type;
  if (uVar1 == 1) {
    this_local = (Am_Value *)0x0;
  }
  else if (uVar1 - 2 < 2) {
    this_local = (Am_Value *)(this->value).wrapper_value;
  }
  else if (uVar1 == 4) {
    if (((this->value).char_value & 1U) == 0) {
      this_local = (Am_Value *)0x0;
    }
    else {
      this_local = (Am_Value *)0x1;
    }
  }
  else if (uVar1 == 5) {
    this_local = (Am_Value *)(long)(this->value).float_value;
  }
  else if (uVar1 == 0x8006) {
    dVar2 = Am_Double_Data::operator_cast_to_double((Am_Double_Data *)(this->value).wrapper_value);
    this_local = (Am_Value *)(long)dVar2;
  }
  else {
    type_error("long",this);
    this_local = (Am_Value *)0x0;
  }
  return (long)this_local;
}

Assistant:

Am_Value::operator long() const
{
  switch (type) {
  case Am_LONG:
  case Am_INT:
    return value.long_value;
  case Am_FLOAT:
    return (long)value.float_value;
  case Am_DOUBLE:
    return (long)(double)*(Am_Double_Data *)value.wrapper_value;
  case Am_BOOL:
    if (value.bool_value)
      return 1L;
    else
      return 0L;
  case Am_ZERO:
    return 0;
  default:
    type_error("long", *this);
    return 0L;
  }
}